

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

void Cof_ManCleanValue(Cof_Man_t *p)

{
  int iVar1;
  bool bVar2;
  uint local_1c;
  Cof_Obj_t *pCStack_18;
  int i;
  Cof_Obj_t *pObj;
  Cof_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if ((int)local_1c < p->nObjData) {
      pCStack_18 = Cof_ManObj(p,local_1c);
      bVar2 = pCStack_18 != (Cof_Obj_t *)0x0;
    }
    if (!bVar2) break;
    pCStack_18->Value = 0;
    iVar1 = Cof_ObjSize(pCStack_18);
    local_1c = iVar1 + local_1c;
  }
  return;
}

Assistant:

void Cof_ManCleanValue( Cof_Man_t * p )  
{
    Cof_Obj_t * pObj;
    int i;
    Cof_ManForEachObj( p, pObj, i )
        pObj->Value = 0;
}